

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

void handle_checkenum(BinarySource *in,strbuf *out)

{
  _Bool _Var1;
  char *str;
  ptrlen pVar2;
  ptrlen valname;
  _Bool local_39;
  _Bool ok;
  ptrlen value;
  ptrlen type;
  strbuf *out_local;
  BinarySource *in_local;
  
  pVar2 = get_word(in);
  valname = get_word(in);
  local_39 = false;
  _Var1 = ptrlen_eq_string(pVar2,"hashalg");
  if (_Var1) {
    local_39 = enum_translate_hashalg(valname,(TD_hashalg *)0x0);
  }
  _Var1 = ptrlen_eq_string(pVar2,"macalg");
  if (_Var1) {
    local_39 = enum_translate_macalg(valname,(TD_macalg *)0x0);
  }
  _Var1 = ptrlen_eq_string(pVar2,"keyalg");
  if (_Var1) {
    local_39 = enum_translate_keyalg(valname,(TD_keyalg *)0x0);
  }
  _Var1 = ptrlen_eq_string(pVar2,"cipheralg");
  if (_Var1) {
    local_39 = enum_translate_cipheralg(valname,(TD_cipheralg *)0x0);
  }
  _Var1 = ptrlen_eq_string(pVar2,"dh_group");
  if (_Var1) {
    local_39 = enum_translate_dh_group(valname,(TD_dh_group *)0x0);
  }
  _Var1 = ptrlen_eq_string(pVar2,"ecdh_alg");
  if (_Var1) {
    local_39 = enum_translate_ecdh_alg(valname,(TD_ecdh_alg *)0x0);
  }
  _Var1 = ptrlen_eq_string(pVar2,"rsaorder");
  if (_Var1) {
    local_39 = enum_translate_rsaorder(valname,(TD_rsaorder *)0x0);
  }
  _Var1 = ptrlen_eq_string(pVar2,"primegenpolicy");
  if (_Var1) {
    local_39 = enum_translate_primegenpolicy(valname,(TD_primegenpolicy *)0x0);
  }
  _Var1 = ptrlen_eq_string(pVar2,"argon2flavour");
  if (_Var1) {
    local_39 = enum_translate_argon2flavour(valname,(TD_argon2flavour *)0x0);
  }
  _Var1 = ptrlen_eq_string(pVar2,"fptype");
  if (_Var1) {
    local_39 = enum_translate_fptype(valname,(TD_fptype *)0x0);
  }
  _Var1 = ptrlen_eq_string(pVar2,"httpdigesthash");
  if (_Var1) {
    local_39 = enum_translate_httpdigesthash(valname,(TD_httpdigesthash *)0x0);
  }
  str = "bad\n";
  if (local_39 != false) {
    str = "ok\n";
  }
  pVar2 = ptrlen_from_asciz(str);
  BinarySink_put_datapl(out->binarysink_,pVar2);
  return;
}

Assistant:

static void handle_checkenum(BinarySource *in, strbuf *out)
{
    ptrlen type = get_word(in);
    ptrlen value = get_word(in);
    bool ok = false;

    #define BEGIN_ENUM_TYPE(name) \
    if (ptrlen_eq_string(type, #name))                  \
        ok = enum_translate_##name(value, NULL);
    #define ENUM_VALUE(name, value)
    #define END_ENUM_TYPE(name)
    #include "testcrypt-enum.h"
    #undef BEGIN_ENUM_TYPE
    #undef ENUM_VALUE
    #undef END_ENUM_TYPE

    put_dataz(out, ok ? "ok\n" : "bad\n");
}